

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O2

void __thiscall
IO::writeDimerActivating
          (IO *this,vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *dimer_arr,
          string *filename)

{
  pointer paVar1;
  ostream *poVar2;
  array<int,_4UL> *__range2;
  long lVar3;
  pointer paVar4;
  array<int,_4UL> timestep;
  ofstream outstream;
  
  std::ofstream::ofstream((string *)&outstream);
  std::ofstream::open((string *)&outstream,(_Ios_Openmode)filename);
  paVar1 = (dimer_arr->
           super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  for (paVar4 = (dimer_arr->
                super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start; paVar4 != paVar1; paVar4 = paVar4 + 1) {
    timestep._M_elems._0_8_ = *(undefined8 *)paVar4->_M_elems;
    timestep._M_elems._8_8_ = *(undefined8 *)(paVar4->_M_elems + 2);
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 4) {
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&outstream,*(int *)((long)timestep._M_elems + lVar3));
      std::operator<<(poVar2,"\t");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&outstream);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&outstream);
  return;
}

Assistant:

void IO::writeDimerActivating(std::vector<std::array<int, 4>> dimer_arr, std::string filename) {
	std::ofstream outstream;
	outstream.open(filename, std::ios::app);
	for (auto timestep: dimer_arr){
		for (auto bound:  timestep){
			outstream << bound << "\t";
		}
		outstream << std::endl;
	}
	outstream.close();
}